

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizer.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::FeatureVectorizer::SerializeWithCachedSizes
          (FeatureVectorizer *this,CodedOutputStream *output)

{
  uint uVar1;
  FeatureVectorizer_InputColumn *value;
  undefined4 local_20;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  FeatureVectorizer *this_local;
  
  local_20 = 0;
  uVar1 = inputlist_size(this);
  for (; local_20 < uVar1; local_20 = local_20 + 1) {
    value = inputlist(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
  }
  return;
}

Assistant:

void FeatureVectorizer::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.FeatureVectorizer)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.FeatureVectorizer.InputColumn inputList = 1;
  for (unsigned int i = 0, n = this->inputlist_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->inputlist(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.FeatureVectorizer)
}